

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int nghttp2_buf_reserve(nghttp2_buf *buf,size_t new_cap,nghttp2_mem *mem)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (long)buf->end - (long)buf->begin;
  iVar3 = 0;
  if (uVar4 < new_cap) {
    uVar4 = uVar4 * 2;
    if (uVar4 <= new_cap) {
      uVar4 = new_cap;
    }
    puVar2 = (uint8_t *)nghttp2_mem_realloc(mem,buf->begin,uVar4);
    if (puVar2 == (uint8_t *)0x0) {
      iVar3 = -0x385;
    }
    else {
      puVar1 = buf->begin;
      buf->pos = puVar2 + ((long)buf->pos - (long)puVar1);
      buf->last = puVar2 + ((long)buf->last - (long)puVar1);
      buf->mark = puVar2 + ((long)buf->mark - (long)puVar1);
      buf->begin = puVar2;
      buf->end = puVar2 + uVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int nghttp2_buf_reserve(nghttp2_buf *buf, size_t new_cap, nghttp2_mem *mem) {
  uint8_t *ptr;
  size_t cap;

  cap = nghttp2_buf_cap(buf);

  if (cap >= new_cap) {
    return 0;
  }

  new_cap = nghttp2_max(new_cap, cap * 2);

  ptr = nghttp2_mem_realloc(mem, buf->begin, new_cap);
  if (ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  buf->pos = ptr + (buf->pos - buf->begin);
  buf->last = ptr + (buf->last - buf->begin);
  buf->mark = ptr + (buf->mark - buf->begin);
  buf->begin = ptr;
  buf->end = ptr + new_cap;

  return 0;
}